

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skin.cpp
# Opt level: O2

void __thiscall rw::Skin::findUsedBones(Skin *this,int32 numVertices)

{
  int iVar1;
  int32 i_1;
  ulong uVar2;
  long lVar3;
  int32 i;
  ulong uVar4;
  uint8 *puVar5;
  float *pfVar6;
  bool bVar7;
  uint8 usedTab [256];
  char local_128 [256];
  
  puVar5 = this->indices;
  pfVar6 = this->weights;
  memset(local_128,0,0x100);
  uVar2 = (ulong)(uint)this->numWeights;
  if (this->numWeights < 1) {
    uVar2 = 0;
  }
  while (bVar7 = numVertices != 0, numVertices = numVertices + -1, bVar7) {
    for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      if ((pfVar6[uVar4] != 0.0) || (NAN(pfVar6[uVar4]))) {
        local_128[puVar5[uVar4]] = local_128[puVar5[uVar4]] + (local_128[puVar5[uVar4]] == '\0');
      }
    }
    puVar5 = puVar5 + 4;
    pfVar6 = pfVar6 + 4;
  }
  this->numUsedBones = 0;
  for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
    if (local_128[lVar3] != '\0') {
      iVar1 = this->numUsedBones;
      this->numUsedBones = iVar1 + 1;
      this->usedBones[iVar1] = (uint8)lVar3;
    }
  }
  return;
}

Assistant:

void
Skin::findUsedBones(int32 numVertices)
{
	uint8 usedTab[256];
	uint8 *indices = this->indices;
	float *weights = this->weights;
	memset(usedTab, 0, 256);
	while(numVertices--){
		for(int32 i = 0; i < this->numWeights; i++){
			if(weights[i] == 0.0f)
				continue;	// TODO: this could probably be optimized
			if(usedTab[indices[i]] == 0)
				usedTab[indices[i]]++;
		}
		indices += 4;
		weights += 4;
	}
	this->numUsedBones = 0;
	for(int32 i = 0; i < 256; i++)
		if(usedTab[i])
			this->usedBones[this->numUsedBones++] = i;
}